

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O0

ON_MeshNgon * __thiscall ON_Mesh::AllocateNgon(ON_Mesh *this,uint Vcount,uint Fcount)

{
  ON_MeshNgon *pOVar1;
  ON_MeshNgon *ngon;
  uint Fcount_local;
  uint Vcount_local;
  ON_Mesh *this_local;
  
  pOVar1 = ON_MeshNgonAllocator::AllocateNgon(&this->m_NgonAllocator,Vcount,Fcount);
  if (pOVar1 != (ON_MeshNgon *)0x0) {
    if (pOVar1->m_Vcount != 0) {
      memset(pOVar1->m_vi,0xff,(ulong)pOVar1->m_Vcount << 2);
    }
    if (pOVar1->m_Fcount != 0) {
      memset(pOVar1->m_fi,0xff,(ulong)pOVar1->m_Fcount << 2);
    }
  }
  return pOVar1;
}

Assistant:

ON_MeshNgon* ON_Mesh::AllocateNgon(
  unsigned int Vcount, 
  unsigned int Fcount
  )
{
  ON_MeshNgon* ngon = m_NgonAllocator.AllocateNgon(Vcount,Fcount);
  if ( ngon  )
  {
    if ( ngon->m_Vcount > 0 )
      memset(ngon->m_vi,0xFF,ngon->m_Vcount*sizeof(ngon->m_vi[0]));
    if ( ngon->m_Fcount > 0 )
      memset(ngon->m_fi,0xFF,ngon->m_Fcount*sizeof(ngon->m_fi[0]));
  }
  return ngon;
}